

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128.cpp
# Opt level: O0

void metrohash128_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  long lVar5;
  long *in_RCX;
  uint in_EDX;
  ulong in_RSI;
  void *in_RDI;
  uint64_t v [4];
  uint8_t *end;
  uint8_t *ptr;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  void *local_28;
  
  local_58 = ((ulong)in_EDX - 0xd6d018f5) * 0x30bc5b29 + in_RSI;
  local_50 = ((ulong)in_EDX + 0xa2aa033b) * 0x62992fc1 + in_RSI;
  local_28 = in_RDI;
  if (0x1f < in_RSI) {
    local_48 = ((ulong)in_EDX + 0xd6d018f5) * 0x62992fc1 + in_RSI;
    local_40 = ((ulong)in_EDX - 0xa2aa033b) * 0x30bc5b29 + in_RSI;
    do {
      uVar1 = read_u64(local_28);
      uVar1 = rotate_right(uVar1 * 0xd6d018f5 + local_58,0x1d);
      local_58 = uVar1 + local_48;
      uVar1 = read_u64((void *)((long)local_28 + 8));
      uVar1 = rotate_right(uVar1 * 0xa2aa033b + local_50,0x1d);
      local_50 = uVar1 + local_40;
      uVar1 = read_u64((void *)((long)local_28 + 0x10));
      uVar1 = rotate_right(uVar1 * 0x62992fc1 + local_48,0x1d);
      local_48 = uVar1 + local_58;
      uVar1 = read_u64((void *)((long)local_28 + 0x18));
      local_28 = (void *)((long)local_28 + 0x20);
      uVar1 = rotate_right(uVar1 * 0x30bc5b29 + local_40,0x1d);
      local_40 = uVar1 + local_50;
    } while (local_28 <= (void *)((long)in_RDI + (in_RSI - 0x20)));
    uVar1 = rotate_right((local_58 + local_40) * 0xd6d018f5 + local_50,0x21);
    local_48 = uVar1 * 0xa2aa033b ^ local_48;
    uVar1 = rotate_right((local_50 + local_48) * 0xa2aa033b + local_58,0x21);
    local_40 = uVar1 * 0xd6d018f5 ^ local_40;
    uVar1 = rotate_right((local_58 + local_48) * 0xd6d018f5 + local_40,0x21);
    local_58 = uVar1 * 0xa2aa033b ^ local_58;
    uVar1 = rotate_right((local_50 + local_40) * 0xa2aa033b + local_48,0x21);
    local_50 = uVar1 * 0xd6d018f5 ^ local_50;
  }
  if (0xf < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u64(local_28);
    uVar1 = rotate_right(uVar1 * 0x62992fc1 + local_58,0x1d);
    uVar2 = read_u64((void *)((long)local_28 + 8));
    local_28 = (void *)((long)local_28 + 0x10);
    uVar2 = rotate_right(uVar2 * 0x62992fc1 + local_50,0x1d);
    uVar3 = rotate_right(uVar1 * 0x12c5448f803e40e9 + uVar2 * 0x30bc5b29,0x1d);
    local_58 = uVar3 * 0xa2aa033b ^ uVar1 * 0x30bc5b29;
    uVar1 = rotate_right(uVar2 * 0x9472cc564ae2c91 + local_58,0x1d);
    local_50 = uVar1 * 0xd6d018f5 ^ uVar2 * 0x30bc5b29;
  }
  if (7 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u64(local_28);
    local_28 = (void *)((long)local_28 + 8);
    uVar1 = rotate_right(uVar1 * 0x62992fc1 + local_58,0x1d);
    uVar2 = rotate_right(uVar1 * 0x12c5448f803e40e9 + local_50,0x1d);
    local_58 = uVar2 * 0xa2aa033b ^ uVar1 * 0x30bc5b29;
  }
  if (3 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u32(local_28);
    local_28 = (void *)((long)local_28 + 4);
    uVar1 = rotate_right(uVar1 * 0x62992fc1 + local_50,0x1d);
    uVar2 = rotate_right(uVar1 * 0x9472cc564ae2c91 + local_58,0x19);
    local_50 = uVar2 * 0xd6d018f5 ^ uVar1 * 0x30bc5b29;
  }
  if (1 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u16(local_28);
    local_28 = (void *)((long)local_28 + 2);
    uVar1 = rotate_right(uVar1 * 0x62992fc1 + local_58,0x1d);
    uVar2 = rotate_right(uVar1 * 0x12c5448f803e40e9 + local_50,0x1e);
    local_58 = uVar2 * 0xa2aa033b ^ uVar1 * 0x30bc5b29;
  }
  if (0 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u8(local_28);
    uVar1 = rotate_right(uVar1 * 0x62992fc1 + local_50,0x1d);
    uVar2 = rotate_right(uVar1 * 0x9472cc564ae2c91 + local_58,0x12);
    local_50 = uVar2 * 0xd6d018f5 ^ uVar1 * 0x30bc5b29;
  }
  uVar1 = rotate_right(local_58 * 0xd6d018f5 + local_50,0x21);
  lVar4 = uVar1 + local_58;
  uVar1 = rotate_right(local_50 * 0xa2aa033b + lVar4,0x21);
  lVar5 = uVar1 + local_50;
  uVar1 = rotate_right(lVar4 * 0x62992fc1 + lVar5,0x21);
  uVar2 = rotate_right(lVar5 * 0x30bc5b29 + uVar1 + lVar4,0x21);
  *in_RCX = uVar1 + lVar4;
  in_RCX[1] = uVar2 + lVar5;
  return;
}

Assistant:

void metrohash128_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xD6D018F5;
    static const uint64_t k1 = 0xA2AA033B;
    static const uint64_t k2 = 0x62992FC1;
    static const uint64_t k3 = 0x30BC5B29; 

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] += read_u64(ptr) * k0; ptr += 8; v[0] = rotate_right(v[0],29) + v[2];
            v[1] += read_u64(ptr) * k1; ptr += 8; v[1] = rotate_right(v[1],29) + v[3];
            v[2] += read_u64(ptr) * k2; ptr += 8; v[2] = rotate_right(v[2],29) + v[0];
            v[3] += read_u64(ptr) * k3; ptr += 8; v[3] = rotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 33) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 33) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 33) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 33) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],29) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 29) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 29) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 29) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] += read_u32(ptr) * k2; ptr += 4; v[1] = rotate_right(v[1],29) * k3;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 25) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] += read_u16(ptr) * k2; ptr += 2; v[0] = rotate_right(v[0],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 30) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
          v[1] += read_u8 (ptr) * k2; v[1] = rotate_right(v[1],29) * k3;
          v[1] ^= rotate_right((v[1] * k3) + v[0], 18) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 33);
    v[1] += rotate_right((v[1] * k1) + v[0], 33);
    v[0] += rotate_right((v[0] * k2) + v[1], 33);
    v[1] += rotate_right((v[1] * k3) + v[0], 33);

    memcpy(out, v, 16);
}